

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::erase(iterator *__return_storage_ptr__,
       parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       *this,iterator it)

{
  iterator local_48;
  
  iterator::operator++(&local_48,&it,0);
  if (&(local_48.inner_)->set_ !=
      (raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
       *)0x0) {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
    ::_erase(&(local_48.inner_)->set_,local_48.it_);
    (__return_storage_ptr__->it_end_).ctrl_ = it.it_end_.ctrl_;
    (__return_storage_ptr__->it_end_).field_1 = it.it_end_.field_1;
    (__return_storage_ptr__->it_).ctrl_ = it.it_.ctrl_;
    (__return_storage_ptr__->it_).field_1 = it.it_.field_1;
    __return_storage_ptr__->inner_ = it.inner_;
    __return_storage_ptr__->inner_end_ = it.inner_end_;
    return __return_storage_ptr__;
  }
  __assert_fail("inner != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0xdb7,
                "void phmap::priv::parallel_hash_set<4, phmap::priv::raw_hash_set, phmap::NullMutex, phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::Enum>>::_erase(iterator) [N = 4, RefSet = phmap::priv::raw_hash_set, Mtx_ = phmap::NullMutex, Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::Enum>]"
               );
}

Assistant:

iterator erase(iterator it) { _erase(it++); return it; }